

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O2

target_ulong
helper_cc_compute_all_x86_64(target_ulong dst,target_ulong src1,target_ulong src2,int op)

{
  byte bVar1;
  int cf;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  byte bVar6;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  target_ulong tVar16;
  bool bVar17;
  bool bVar18;
  ushort uVar2;
  int iVar7;
  ushort uVar12;
  
  bVar11 = (byte)dst;
  uVar12 = (ushort)dst;
  uVar15 = (uint)dst;
  bVar1 = (byte)src1;
  uVar2 = (ushort)src1;
  uVar8 = (uint)src1;
  cVar5 = (char)src2;
  iVar7 = (int)src2;
  bVar6 = (byte)(dst >> 0x38);
  uVar13 = (uint)(src1 >> 0x20);
  switch(op) {
  case 1:
    goto switchD_004c5924_caseD_1;
  case 2:
    tVar16 = (ulong)(src1 != 0) |
             (ulong)((uint)(src1 != 0) << 0xb | uVar15 & 0x80 | (uint)((dst & 0xff) == 0) << 6) |
             (ulong)"\x04"[dst & 0xff];
    break;
  case 3:
    bVar1 = "\x04"[dst & 0xff];
    bVar18 = uVar12 == 0;
    uVar14 = uVar15 >> 8 & 0x80;
    goto LAB_004c5e45;
  case 4:
    bVar1 = "\x04"[dst & 0xff];
    bVar18 = uVar15 == 0;
    uVar14 = uVar15 >> 0x18 & 0xffffff80;
LAB_004c5e45:
    uVar4 = (ulong)(src1 != 0);
    uVar14 = uVar14 | (uint)bVar18 << 6;
    uVar13 = (uint)(src1 != 0) << 0xb;
LAB_004c5e4c:
    uVar3 = (ulong)(uVar13 | uVar14);
LAB_004c6004:
    uVar9 = (ulong)bVar1;
    uVar3 = uVar3 | uVar4;
    goto LAB_004c6007;
  case 5:
    tVar16 = (ulong)(src1 != 0) |
             (ulong)((uint)(src1 != 0) << 0xb | bVar6 & 0xffffff80 | (uint)(dst == 0) << 6) |
             (ulong)"\x04"[dst & 0xff];
    break;
  case 6:
    return (ulong)(byte)(((bVar11 - bVar1 ^ bVar1 ^ bVar11) & 0x10) + (bVar11 < bVar1) |
                        "\x04"[dst & 0xff]) |
           (ulong)(((uint)(bVar1 ^ bVar11) & ~(uint)(byte)(bVar11 - bVar1 ^ bVar1) & 0x80) << 4 |
                  uVar15 & 0x80 | (uint)(bVar11 == 0) << 6);
  case 7:
    bVar6 = "\x04"[dst & 0xff];
    uVar14 = (~((ushort)(uVar12 - uVar2) ^ uVar8) & (uVar8 ^ uVar15)) >> 4 & 0x800 |
             uVar15 >> 8 & 0x80 | (uint)(uVar12 == 0) << 6;
    uVar13 = (uint)(uVar12 < uVar2) | (uVar8 ^ uVar15 ^ (uint)(ushort)(uVar12 - uVar2)) & 0x10;
    goto LAB_004c6146;
  case 8:
    bVar18 = uVar15 < uVar8;
    bVar6 = "\x04"[dst & 0xff];
    uVar14 = uVar8 ^ uVar15;
    uVar13 = uVar15 >> 0x18 & 0xffffff80 | (uint)(uVar15 == 0) << 6 |
             (uVar14 ^ uVar15 - uVar8) & 0x10;
    uVar8 = ~(uVar15 - uVar8 ^ uVar8);
    goto LAB_004c5e99;
  case 9:
    bVar18 = dst < src1;
    bVar1 = "\x04"[dst & 0xff];
    uVar3 = src1 ^ dst;
    uVar8 = bVar6 & 0xffffff80 | (uint)(dst == 0) << 6 | ((uint)uVar3 ^ (uint)(dst - src1)) & 0x10;
    uVar13 = ~((uint)(dst - src1 >> 0x20) ^ uVar13);
    goto LAB_004c6283;
  case 10:
    bVar18 = bVar11 <= bVar1;
    if (cVar5 == '\0') {
      bVar18 = bVar11 < bVar1;
    }
    bVar6 = bVar11 - (cVar5 + bVar1);
    return (ulong)(byte)((bVar6 ^ bVar1 ^ bVar11) & 0x10 | bVar18 | "\x04"[dst & 0xff]) |
           (ulong)(((uint)(bVar1 ^ bVar11) & ~(uint)(bVar6 ^ bVar1) & 0x80) << 4 |
                  uVar15 & 0x80 | (uint)(bVar11 == 0) << 6);
  case 0xb:
    bVar18 = uVar12 <= uVar2;
    if ((short)src2 == 0) {
      bVar18 = uVar12 < uVar2;
    }
    uVar13 = uVar15 - (iVar7 + uVar8);
    uVar14 = (~(uVar13 ^ uVar8) & (uVar8 ^ uVar15)) >> 4 & 0x800 |
             uVar15 >> 8 & 0x80 | (uint)(uVar12 == 0) << 6;
    uVar13 = (uVar13 ^ uVar8 ^ uVar15) & 0x10 | (uint)bVar18 | (uint)"\x04"[dst & 0xff];
    goto LAB_004c63eb;
  case 0xc:
    bVar18 = uVar15 <= uVar8;
    if (iVar7 == 0) {
      bVar18 = uVar15 < uVar8;
    }
    uVar13 = uVar15 - (iVar7 + uVar8);
    uVar14 = (uint)"\x04"[dst & 0xff];
    uVar13 = (uint)bVar18 |
             (~(uVar13 ^ uVar8) & (uVar8 ^ uVar15)) >> 0x14 & 0x800 |
             uVar15 >> 0x18 & 0xffffff80 | (uint)(uVar15 == 0) << 6 |
             (uVar13 ^ uVar8 ^ uVar15) & 0x10;
    goto LAB_004c63eb;
  case 0xd:
    bVar18 = dst <= src1;
    if (src2 == 0) {
      bVar18 = dst < src1;
    }
    lVar10 = dst - (src2 + src1);
    uVar9 = (ulong)"\x04"[dst & 0xff];
    uVar3 = (ulong)bVar18 |
            (ulong)((~((uint)((ulong)lVar10 >> 0x20) ^ uVar13) & (uint)((src1 ^ dst) >> 0x20)) >>
                    0x14 & 0x800 |
                   bVar6 & 0xffffff80 | (uint)(dst == 0) << 6 |
                   ((uint)lVar10 ^ (uint)(src1 ^ dst)) & 0x10);
    goto LAB_004c6007;
  case 0xe:
    bVar6 = bVar1 + bVar11 ^ bVar11;
    uVar9 = (ulong)((((bVar1 + bVar11 ^ bVar1) & bVar6) & 0x80) << 4 |
                   uVar15 & 0x80 | (uint)(bVar11 == 0) << 6);
    uVar3 = (ulong)(byte)(((bVar6 ^ bVar1) & 0x10) + CARRY1(bVar1,bVar11) | "\x04"[dst & 0xff]);
    goto LAB_004c60e9;
  case 0xf:
    bVar6 = "\x04"[dst & 0xff];
    uVar13 = (ushort)(uVar2 + uVar12) ^ uVar15;
    uVar14 = (((ushort)(uVar2 + uVar12) ^ uVar8) & uVar13) >> 4 & 0x800 |
             uVar15 >> 8 & 0x80 | (uint)(uVar12 == 0) << 6;
    uVar13 = (uint)CARRY2(uVar2,uVar12) | (uVar13 ^ uVar8) & 0x10;
LAB_004c6146:
    uVar13 = uVar13 | bVar6;
LAB_004c61be:
    return (ulong)(uVar13 | uVar14);
  case 0x10:
    bVar18 = CARRY4(uVar8,uVar15);
    bVar6 = "\x04"[dst & 0xff];
    uVar14 = uVar8 + uVar15 ^ uVar15;
    uVar13 = uVar15 >> 0x18 & 0xffffff80 | (uint)(uVar15 == 0) << 6 | (uVar14 ^ uVar8) & 0x10;
    uVar8 = uVar8 + uVar15 ^ uVar8;
LAB_004c5e99:
    tVar16 = (target_ulong)((uint)bVar18 | (uVar8 & uVar14) >> 0x14 & 0x800 | uVar13 | (uint)bVar6);
    break;
  case 0x11:
    bVar18 = CARRY8(src1,dst);
    bVar1 = "\x04"[dst & 0xff];
    uVar3 = src1 + dst ^ dst;
    uVar8 = bVar6 & 0xffffff80 | (uint)(dst == 0) << 6 | (uVar8 ^ (uint)uVar3) & 0x10;
    uVar13 = (uint)(src1 + dst >> 0x20) ^ uVar13;
LAB_004c6283:
    tVar16 = (ulong)bVar18 | (ulong)((uVar13 & (uint)(uVar3 >> 0x20)) >> 0x14 & 0x800 | uVar8) |
             (ulong)bVar1;
    break;
  case 0x12:
    bVar6 = bVar1 + bVar11 + cVar5;
    bVar18 = bVar6 <= bVar1;
    if (cVar5 == '\0') {
      bVar18 = bVar6 < bVar1;
    }
    uVar9 = (ulong)(((byte)((bVar6 ^ bVar1) & (bVar6 ^ bVar11)) & 0x80) << 4 |
                   uVar15 & 0x80 | (uint)(bVar11 == 0) << 6);
    uVar3 = (ulong)(byte)((bVar6 ^ bVar11 ^ bVar1) & 0x10 | bVar18 | "\x04"[dst & 0xff]);
    goto LAB_004c60e9;
  case 0x13:
    uVar13 = iVar7 + uVar8 + uVar15;
    bVar18 = (ushort)uVar13 <= uVar2;
    if ((short)src2 == 0) {
      bVar18 = (ushort)uVar13 < uVar2;
    }
    uVar14 = ((uVar13 ^ uVar8) & (uVar13 ^ uVar15)) >> 4 & 0x800 |
             uVar15 >> 8 & 0x80 | (uint)(uVar12 == 0) << 6;
    uVar13 = (uVar13 ^ uVar15 ^ uVar8) & 0x10 | (uint)bVar18 | (uint)"\x04"[dst & 0xff];
    goto LAB_004c61be;
  case 0x14:
    uVar13 = uVar8 + uVar15 + iVar7;
    bVar18 = uVar13 <= uVar8;
    if (iVar7 == 0) {
      bVar18 = uVar13 < uVar8;
    }
    uVar14 = (uint)"\x04"[dst & 0xff];
    uVar13 = (uint)bVar18 |
             ((uVar13 ^ uVar8) & (uVar13 ^ uVar15)) >> 0x14 & 0x800 |
             uVar15 >> 0x18 & 0xffffff80 | (uint)(uVar15 == 0) << 6 |
             (uVar13 ^ uVar15 ^ uVar8) & 0x10;
    goto LAB_004c63eb;
  case 0x15:
    uVar3 = src1 + dst + src2;
    bVar18 = uVar3 <= src1;
    if (src2 == 0) {
      bVar18 = uVar3 < src1;
    }
    bVar1 = "\x04"[dst & 0xff];
    uVar4 = (ulong)((((uint)(uVar3 >> 0x20) ^ uVar13) & (uint)((uVar3 ^ dst) >> 0x20)) >> 0x14 &
                    0x800 | bVar6 & 0xffffff80 | (uint)(dst == 0) << 6 |
                            (uVar8 ^ (uint)(uVar3 ^ dst)) & 0x10);
    uVar3 = (ulong)bVar18;
    goto LAB_004c6004;
  case 0x16:
    uVar3 = (ulong)"\x04"[dst & 0xff];
    uVar9 = (ulong)(uVar15 & 0x80 | (uint)((dst & 0xff) == 0) << 6);
    goto LAB_004c640c;
  case 0x17:
    bVar6 = "\x04"[dst & 0xff];
    bVar18 = uVar12 == 0;
    uVar13 = uVar15 >> 8 & 0x80;
    goto LAB_004c6433;
  case 0x18:
    bVar6 = "\x04"[dst & 0xff];
    bVar18 = uVar15 == 0;
    uVar13 = uVar15 >> 0x18 & 0xffffff80;
LAB_004c6433:
    uVar3 = (ulong)bVar6;
    uVar9 = (ulong)(uVar13 | (uint)bVar18 << 6);
LAB_004c64d4:
    src1 = uVar9 | uVar3;
switchD_004c5924_caseD_1:
    return src1;
  case 0x19:
    uVar3 = (ulong)"\x04"[dst & 0xff];
    uVar9 = (ulong)(bVar6 & 0xffffff80 | (uint)(dst == 0) << 6);
    goto LAB_004c64d4;
  case 0x1a:
    bVar6 = bVar11 - 1;
    bVar18 = bVar11 == 0x80;
    goto LAB_004c64be;
  case 0x1b:
    uVar13 = uVar15 - 1;
    bVar6 = "\x04"[dst & 0xff];
    bVar18 = uVar12 == 0x8000;
    goto LAB_004c6552;
  case 0x1c:
    uVar13 = uVar15 - 1;
    bVar6 = "\x04"[dst & 0xff];
    uVar14 = 0;
    goto LAB_004c5eea;
  case 0x1d:
    uVar13 = uVar15 - 1;
    bVar1 = "\x04"[dst & 0xff];
    tVar16 = 0x8000000000000000;
    goto LAB_004c6472;
  case 0x1e:
    bVar6 = bVar11 + 1;
    bVar18 = bVar11 == 0x7f;
LAB_004c64be:
    uVar3 = (ulong)(byte)((bVar6 ^ bVar11) & 0x10 | bVar1 | "\x04"[dst & 0xff]);
    uVar9 = (ulong)(uVar15 & 0x80 | (uint)(bVar11 == 0) << 6 | (uint)bVar18 << 0xb);
    goto LAB_004c64d4;
  case 0x1f:
    uVar13 = uVar15 + 1;
    bVar6 = "\x04"[dst & 0xff];
    bVar18 = uVar12 == 0x7fff;
LAB_004c6552:
    uVar9 = (ulong)bVar6;
    uVar3 = src1 & 0xffff | (ulong)((uint)(dst >> 8) & 0x80) | (ulong)(uVar12 == 0) << 6 |
            (ulong)((uint)bVar18 << 0xb | (uVar13 ^ uVar15) & 0x10);
LAB_004c6569:
    return uVar3 | uVar9;
  case 0x20:
    uVar13 = uVar15 + 1;
    bVar6 = "\x04"[dst & 0xff];
    uVar14 = (uint)(uVar15 == 0x7fffffff);
LAB_004c5eea:
    uVar9 = (ulong)bVar6;
    uVar3 = (ulong)(int)((uint)(dst >> 0x18) & 0x80 | uVar8 | (uint)(uVar15 == 0) << 6 |
                        uVar14 << 0xb | (uVar13 ^ uVar15) & 0x10);
    goto LAB_004c6569;
  case 0x21:
    uVar13 = uVar15 + 1;
    bVar1 = "\x04"[dst & 0xff];
    tVar16 = 0x7fffffffffffffff;
LAB_004c6472:
    return (long)(int)(uVar8 | (uint)(dst == 0) << 6 | (uint)(dst == tVar16) << 0xb |
                               bVar6 & 0xffffff80 | (uVar13 ^ uVar15) & 0x10 | (uint)bVar1);
  case 0x22:
    uVar3 = (src1 & 0xff) >> 7;
    goto LAB_004c5b2a;
  case 0x23:
    uVar4 = (src1 & 0xffff) >> 0xf;
    bVar1 = "\x04"[dst & 0xff];
    uVar14 = uVar15 >> 8 & 0x80 | (uint)(uVar12 == 0) << 6;
    uVar13 = (uVar8 ^ uVar15) >> 4 & 0x800;
    goto LAB_004c5e4c;
  case 0x24:
    uVar14 = (uint)"\x04"[dst & 0xff];
    uVar13 = (uVar8 ^ uVar15) >> 0x14 & 0x800 |
             uVar15 >> 0x18 & 0xffffff80 | (uint)(uVar15 == 0) << 6 | (uint)(src1 >> 0x1f) & 1;
LAB_004c63eb:
    return (ulong)(uVar13 | uVar14);
  case 0x25:
    uVar3 = src1 >> 0x3f;
    goto LAB_004c5c2a;
  case 0x26:
    uVar3 = (ulong)(uVar8 & 1);
LAB_004c5b2a:
    uVar9 = (ulong)"\x04"[dst & 0xff];
    uVar3 = (((uVar8 ^ uVar15) & 0x80) << 4 | uVar15 & 0x80 | (uint)((dst & 0xff) == 0) << 6) |
            uVar3;
LAB_004c60e9:
    return uVar3 | uVar9;
  case 0x27:
    bVar1 = "\x04"[dst & 0xff];
    uVar3 = (ulong)(uVar15 >> 8 & 0x80 | uVar8 & 1 | (uint)(uVar12 == 0) << 6);
    uVar13 = (uVar8 ^ uVar15) >> 4;
    goto LAB_004c650f;
  case 0x28:
    uVar9 = (ulong)"\x04"[dst & 0xff];
    uVar3 = (ulong)((uVar8 ^ uVar15) >> 0x14 & 0x800 |
                   uVar15 >> 0x18 & 0xffffff80 | uVar8 & 1 | (uint)(uVar15 == 0) << 6);
    goto LAB_004c6007;
  case 0x29:
    uVar3 = (ulong)(uVar8 & 1);
LAB_004c5c2a:
    bVar1 = "\x04"[dst & 0xff];
    uVar3 = (ulong)(bVar6 & 0xffffff80) | (ulong)(dst == 0) << 6 | uVar3;
    uVar13 = (uVar13 ^ (uint)(dst >> 0x20)) >> 0x14;
LAB_004c650f:
    uVar9 = (ulong)bVar1;
    uVar3 = uVar13 & 0x800 | uVar3;
    goto LAB_004c6569;
  case 0x2a:
    bVar17 = bVar1 == 0;
    bVar18 = bVar11 == 0;
    uVar15 = uVar15 & 0x80;
    goto LAB_004c5f8c;
  case 0x2b:
    bVar18 = uVar2 == 0;
    bVar17 = uVar12 == 0;
    uVar13 = uVar15 >> 8 & 0x80;
    goto LAB_004c640a;
  case 0x2c:
    bVar18 = uVar8 == 0;
    bVar17 = uVar15 == 0;
    uVar13 = uVar15 >> 0x18 & 0xffffff80;
LAB_004c640a:
    uVar3 = (ulong)bVar18;
    uVar9 = (ulong)(uVar13 | (uint)bVar17 << 6);
    goto LAB_004c640c;
  case 0x2d:
    bVar17 = src1 == 0;
    bVar18 = dst == 0;
    uVar15 = bVar6 & 0xffffff80;
LAB_004c5f8c:
    uVar3 = (ulong)bVar17;
    uVar9 = (ulong)(uVar15 | (uint)bVar18 << 6);
LAB_004c640c:
    return uVar9 | uVar3;
  case 0x2e:
    return src1 & 0xfffffffffffffffe | dst;
  case 0x2f:
    uVar3 = src1 & 0xfffffffffffff7ff;
    uVar9 = src2 << 0xb;
LAB_004c6007:
    return uVar3 | uVar9;
  case 0x30:
    return src2 << 0xb | src1 & 0xfffffffffffff7fe | dst;
  case 0x31:
    return 0x44;
  case 0x32:
    tVar16 = (ulong)(src1 == 0) << 6;
    break;
  default:
    return 0;
  }
  return tVar16;
}

Assistant:

target_ulong helper_cc_compute_all(target_ulong dst, target_ulong src1,
                                   target_ulong src2, int op)
{
    switch (op) {
    default: /* should never happen */
        return 0;

    case CC_OP_EFLAGS:
        return src1;
    case CC_OP_CLR:
        return CC_Z | CC_P;
    case CC_OP_POPCNT:
        return src1 ? 0 : CC_Z;

    case CC_OP_MULB:
        return compute_all_mulb(dst, src1);
    case CC_OP_MULW:
        return compute_all_mulw(dst, src1);
    case CC_OP_MULL:
        return compute_all_mull(dst, src1);

    case CC_OP_ADDB:
        return compute_all_addb(dst, src1);
    case CC_OP_ADDW:
        return compute_all_addw(dst, src1);
    case CC_OP_ADDL:
        return compute_all_addl(dst, src1);

    case CC_OP_ADCB:
        return compute_all_adcb(dst, src1, src2);
    case CC_OP_ADCW:
        return compute_all_adcw(dst, src1, src2);
    case CC_OP_ADCL:
        return compute_all_adcl(dst, src1, src2);

    case CC_OP_SUBB:
        return compute_all_subb(dst, src1);
    case CC_OP_SUBW:
        return compute_all_subw(dst, src1);
    case CC_OP_SUBL:
        return compute_all_subl(dst, src1);

    case CC_OP_SBBB:
        return compute_all_sbbb(dst, src1, src2);
    case CC_OP_SBBW:
        return compute_all_sbbw(dst, src1, src2);
    case CC_OP_SBBL:
        return compute_all_sbbl(dst, src1, src2);

    case CC_OP_LOGICB:
        return compute_all_logicb(dst, src1);
    case CC_OP_LOGICW:
        return compute_all_logicw(dst, src1);
    case CC_OP_LOGICL:
        return compute_all_logicl(dst, src1);

    case CC_OP_INCB:
        return compute_all_incb(dst, src1);
    case CC_OP_INCW:
        return compute_all_incw(dst, src1);
    case CC_OP_INCL:
        return compute_all_incl(dst, src1);

    case CC_OP_DECB:
        return compute_all_decb(dst, src1);
    case CC_OP_DECW:
        return compute_all_decw(dst, src1);
    case CC_OP_DECL:
        return compute_all_decl(dst, src1);

    case CC_OP_SHLB:
        return compute_all_shlb(dst, src1);
    case CC_OP_SHLW:
        return compute_all_shlw(dst, src1);
    case CC_OP_SHLL:
        return compute_all_shll(dst, src1);

    case CC_OP_SARB:
        return compute_all_sarb(dst, src1);
    case CC_OP_SARW:
        return compute_all_sarw(dst, src1);
    case CC_OP_SARL:
        return compute_all_sarl(dst, src1);

    case CC_OP_BMILGB:
        return compute_all_bmilgb(dst, src1);
    case CC_OP_BMILGW:
        return compute_all_bmilgw(dst, src1);
    case CC_OP_BMILGL:
        return compute_all_bmilgl(dst, src1);

    case CC_OP_ADCX:
        return compute_all_adcx(dst, src1, src2);
    case CC_OP_ADOX:
        return compute_all_adox(dst, src1, src2);
    case CC_OP_ADCOX:
        return compute_all_adcox(dst, src1, src2);

#ifdef TARGET_X86_64
    case CC_OP_MULQ:
        return compute_all_mulq(dst, src1);
    case CC_OP_ADDQ:
        return compute_all_addq(dst, src1);
    case CC_OP_ADCQ:
        return compute_all_adcq(dst, src1, src2);
    case CC_OP_SUBQ:
        return compute_all_subq(dst, src1);
    case CC_OP_SBBQ:
        return compute_all_sbbq(dst, src1, src2);
    case CC_OP_LOGICQ:
        return compute_all_logicq(dst, src1);
    case CC_OP_INCQ:
        return compute_all_incq(dst, src1);
    case CC_OP_DECQ:
        return compute_all_decq(dst, src1);
    case CC_OP_SHLQ:
        return compute_all_shlq(dst, src1);
    case CC_OP_SARQ:
        return compute_all_sarq(dst, src1);
    case CC_OP_BMILGQ:
        return compute_all_bmilgq(dst, src1);
#endif
    }
}